

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O3

bool __thiscall
re2::PCRE::Rewrite(PCRE *this,string *out,StringPiece *rewrite,StringPiece *text,int *vec,int veclen
                  )

{
  uint uVar1;
  char *pcVar2;
  ostringstream *poVar3;
  ostream *poVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  LogMessage local_1b0;
  
  if (0 < (long)rewrite->length_) {
    pcVar7 = rewrite->ptr_;
    pcVar6 = pcVar7 + rewrite->length_;
    do {
      if (*pcVar7 == '\\') {
        pcVar2 = pcVar7 + 1;
        pcVar7 = pcVar7 + 1;
        uVar1 = (int)*pcVar2 - 0x30;
        if (9 < uVar1) {
          if (*pcVar2 != '\\') {
            LogMessage::LogMessage
                      (&local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc"
                       ,0x29e,2);
            poVar3 = &local_1b0.str_;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar3,"invalid rewrite pattern: ",0x19);
            pcVar7 = rewrite->ptr_;
            if (pcVar7 == (char *)0x0) {
              std::ios::clear((int)poVar3 + (int)*(undefined8 *)(local_1b0._8_8_ + -0x18));
            }
            else {
              sVar5 = strlen(pcVar7);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,pcVar7,sVar5);
            }
            goto LAB_0012a067;
          }
          goto LAB_00129f43;
        }
        if (veclen <= (int)uVar1) {
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/pcre.cc"
                     ,0x293,2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0.str_,"requested group ",0x10);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_1b0.str_,uVar1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," in regexp ",0xb);
          pcVar7 = rewrite->ptr_;
          if (pcVar7 == (char *)0x0) {
            std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
          }
          else {
            sVar5 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,sVar5);
          }
LAB_0012a067:
          LogMessage::~LogMessage(&local_1b0);
          return false;
        }
        if (-1 < (long)vec[uVar1 * 2]) {
          std::__cxx11::string::append((char *)out,(ulong)(text->ptr_ + vec[uVar1 * 2]));
        }
      }
      else {
LAB_00129f43:
        std::__cxx11::string::push_back((char)out);
      }
      pcVar7 = pcVar7 + 1;
    } while (pcVar7 < pcVar6);
  }
  return true;
}

Assistant:

bool PCRE::Rewrite(string *out, const StringPiece &rewrite,
                 const StringPiece &text, int *vec, int veclen) const {
  int number_of_capturing_groups = NumberOfCapturingGroups();
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    int c = *s;
    if (c == '\\') {
      c = *++s;
      if (isdigit(c)) {
        int n = (c - '0');
        if (n >= veclen) {
          if (n <= number_of_capturing_groups) {
            // unmatched optional capturing group. treat
            // its value as empty string; i.e., nothing to append.
          } else {
            PCREPORT(ERROR) << "requested group " << n
                          << " in regexp " << rewrite.data();
            return false;
          }
        }
        int start = vec[2 * n];
        if (start >= 0)
          out->append(text.data() + start, vec[2 * n + 1] - start);
      } else if (c == '\\') {
        out->push_back('\\');
      } else {
        PCREPORT(ERROR) << "invalid rewrite pattern: " << rewrite.data();
        return false;
      }
    } else {
      out->push_back(c);
    }
  }
  return true;
}